

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::CartesianProductGenerator<const_libaom_test::CodecFactory_*,_int,_unsigned_int>::
IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::Advance
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this)

{
  ParamIterator<unsigned_int> *in_RDI;
  
  std::
  get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>>
            ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>_>
              *)0x8cd69c);
  ParamIterator<unsigned_int>::operator++(in_RDI);
  CartesianProductGenerator<libaom_test::CodecFactory_const*,int,unsigned_int>::
  IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul>>::AdvanceIfEnd<2ul>(this);
  ComputeCurrentValue(this);
  return;
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }